

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void term_copy_stuff_from_conf(Terminal *term)

{
  _Bool _Var1;
  char cVar2;
  wchar_t wVar3;
  char *__s;
  size_t sVar4;
  char *pcVar5;
  char *n;
  char *local_20;
  
  _Var1 = conf_get_bool(term->conf,0x8f);
  term->ansi_colour = _Var1;
  _Var1 = conf_get_bool(term->conf,0x8d);
  term->no_arabicshaping = _Var1;
  wVar3 = conf_get_int(term->conf,0x70);
  term->beep = wVar3;
  _Var1 = conf_get_bool(term->conf,0x72);
  term->bellovl = _Var1;
  wVar3 = conf_get_int(term->conf,0x73);
  term->bellovl_n = wVar3;
  wVar3 = conf_get_int(term->conf,0x75);
  term->bellovl_s = wVar3;
  wVar3 = conf_get_int(term->conf,0x74);
  term->bellovl_t = wVar3;
  _Var1 = conf_get_bool(term->conf,0x8e);
  term->no_bidi = _Var1;
  _Var1 = conf_get_bool(term->conf,0x48);
  term->bksp_is_delete = _Var1;
  _Var1 = conf_get_bool(term->conf,0x6f);
  term->blink_cur = _Var1;
  _Var1 = conf_get_bool(term->conf,0x7b);
  term->blinktext = _Var1;
  _Var1 = conf_get_bool(term->conf,0xa7);
  term->cjk_ambig_wide = _Var1;
  wVar3 = conf_get_int(term->conf,0x7e);
  term->conf_height = wVar3;
  wVar3 = conf_get_int(term->conf,0x7d);
  term->conf_width = wVar3;
  _Var1 = conf_get_bool(term->conf,0xcc);
  term->crhaslf = _Var1;
  _Var1 = conf_get_bool(term->conf,100);
  term->erase_to_scrollback = _Var1;
  wVar3 = conf_get_int(term->conf,0x4a);
  term->funky_type = wVar3;
  wVar3 = conf_get_int(term->conf,0x4b);
  term->sharrow_type = wVar3;
  _Var1 = conf_get_bool(term->conf,0x6d);
  term->lfhascr = _Var1;
  _Var1 = conf_get_bool(term->conf,0x84);
  term->logflush = _Var1;
  wVar3 = conf_get_int(term->conf,0x82);
  term->logtype = wVar3;
  _Var1 = conf_get_bool(term->conf,0x9c);
  term->mouse_override = _Var1;
  _Var1 = conf_get_bool(term->conf,0x58);
  term->nethack_keypad = _Var1;
  _Var1 = conf_get_bool(term->conf,0x50);
  term->no_alt_screen = _Var1;
  _Var1 = conf_get_bool(term->conf,0x4c);
  term->no_applic_c = _Var1;
  _Var1 = conf_get_bool(term->conf,0x4d);
  term->no_applic_k = _Var1;
  _Var1 = conf_get_bool(term->conf,0x53);
  term->no_dbackspace = _Var1;
  _Var1 = conf_get_bool(term->conf,0x4e);
  term->no_mouse_rep = _Var1;
  _Var1 = conf_get_bool(term->conf,0x54);
  term->no_remote_charset = _Var1;
  _Var1 = conf_get_bool(term->conf,0x4f);
  term->no_remote_resize = _Var1;
  _Var1 = conf_get_bool(term->conf,0x51);
  term->no_remote_wintitle = _Var1;
  _Var1 = conf_get_bool(term->conf,0x52);
  term->no_remote_clearscroll = _Var1;
  _Var1 = conf_get_bool(term->conf,0x99);
  term->rawcnp = _Var1;
  _Var1 = conf_get_bool(term->conf,0x9a);
  term->utf8linedraw = _Var1;
  _Var1 = conf_get_bool(term->conf,0x97);
  term->rect_select = _Var1;
  wVar3 = conf_get_int(term->conf,0x55);
  term->remote_qtitle_action = wVar3;
  _Var1 = conf_get_bool(term->conf,0x49);
  term->rxvt_homeend = _Var1;
  _Var1 = conf_get_bool(term->conf,99);
  term->scroll_on_disp = _Var1;
  _Var1 = conf_get_bool(term->conf,0x62);
  term->scroll_on_key = _Var1;
  _Var1 = conf_get_bool(term->conf,0x4e);
  term->xterm_mouse_forbidden = _Var1;
  _Var1 = conf_get_bool(term->conf,0x90);
  term->xterm_256_colour = _Var1;
  _Var1 = conf_get_bool(term->conf,0x91);
  term->true_colour = _Var1;
  __s = conf_get_str(term->conf,0x8b);
  sVar4 = strlen(__s);
  pcVar5 = (char *)safemalloc((long)(int)sVar4,1,0);
  term->answerback = pcVar5;
  term->answerbacklen = L'\0';
  if (*__s != '\0') {
    do {
      cVar2 = ctrlparse(__s,&local_20);
      if (local_20 == (char *)0x0) {
        cVar2 = *__s;
        __s = __s + 1;
        wVar3 = term->answerbacklen;
        term->answerbacklen = wVar3 + L'\x01';
        term->answerback[wVar3] = cVar2;
      }
      else {
        wVar3 = term->answerbacklen;
        term->answerbacklen = wVar3 + L'\x01';
        term->answerback[wVar3] = cVar2;
        __s = local_20;
      }
    } while (*__s != '\0');
  }
  return;
}

Assistant:

void term_copy_stuff_from_conf(Terminal *term)
{
    term->ansi_colour = conf_get_bool(term->conf, CONF_ansi_colour);
    term->no_arabicshaping = conf_get_bool(term->conf, CONF_no_arabicshaping);
    term->beep = conf_get_int(term->conf, CONF_beep);
    term->bellovl = conf_get_bool(term->conf, CONF_bellovl);
    term->bellovl_n = conf_get_int(term->conf, CONF_bellovl_n);
    term->bellovl_s = conf_get_int(term->conf, CONF_bellovl_s);
    term->bellovl_t = conf_get_int(term->conf, CONF_bellovl_t);
    term->no_bidi = conf_get_bool(term->conf, CONF_no_bidi);
    term->bksp_is_delete = conf_get_bool(term->conf, CONF_bksp_is_delete);
    term->blink_cur = conf_get_bool(term->conf, CONF_blink_cur);
    term->blinktext = conf_get_bool(term->conf, CONF_blinktext);
    term->cjk_ambig_wide = conf_get_bool(term->conf, CONF_cjk_ambig_wide);
    term->conf_height = conf_get_int(term->conf, CONF_height);
    term->conf_width = conf_get_int(term->conf, CONF_width);
    term->crhaslf = conf_get_bool(term->conf, CONF_crhaslf);
    term->erase_to_scrollback = conf_get_bool(term->conf, CONF_erase_to_scrollback);
    term->funky_type = conf_get_int(term->conf, CONF_funky_type);
    term->sharrow_type = conf_get_int(term->conf, CONF_sharrow_type);
    term->lfhascr = conf_get_bool(term->conf, CONF_lfhascr);
    term->logflush = conf_get_bool(term->conf, CONF_logflush);
    term->logtype = conf_get_int(term->conf, CONF_logtype);
    term->mouse_override = conf_get_bool(term->conf, CONF_mouse_override);
    term->nethack_keypad = conf_get_bool(term->conf, CONF_nethack_keypad);
    term->no_alt_screen = conf_get_bool(term->conf, CONF_no_alt_screen);
    term->no_applic_c = conf_get_bool(term->conf, CONF_no_applic_c);
    term->no_applic_k = conf_get_bool(term->conf, CONF_no_applic_k);
    term->no_dbackspace = conf_get_bool(term->conf, CONF_no_dbackspace);
    term->no_mouse_rep = conf_get_bool(term->conf, CONF_no_mouse_rep);
    term->no_remote_charset = conf_get_bool(term->conf, CONF_no_remote_charset);
    term->no_remote_resize = conf_get_bool(term->conf, CONF_no_remote_resize);
    term->no_remote_wintitle = conf_get_bool(term->conf, CONF_no_remote_wintitle);
    term->no_remote_clearscroll = conf_get_bool(term->conf, CONF_no_remote_clearscroll);
    term->rawcnp = conf_get_bool(term->conf, CONF_rawcnp);
    term->utf8linedraw = conf_get_bool(term->conf, CONF_utf8linedraw);
    term->rect_select = conf_get_bool(term->conf, CONF_rect_select);
    term->remote_qtitle_action = conf_get_int(term->conf, CONF_remote_qtitle_action);
    term->rxvt_homeend = conf_get_bool(term->conf, CONF_rxvt_homeend);
    term->scroll_on_disp = conf_get_bool(term->conf, CONF_scroll_on_disp);
    term->scroll_on_key = conf_get_bool(term->conf, CONF_scroll_on_key);
    term->xterm_mouse_forbidden = conf_get_bool(term->conf, CONF_no_mouse_rep);
    term->xterm_256_colour = conf_get_bool(term->conf, CONF_xterm_256_colour);
    term->true_colour = conf_get_bool(term->conf, CONF_true_colour);

    /*
     * Parse the control-character escapes in the configured
     * answerback string.
     */
    {
        char *answerback = conf_get_str(term->conf, CONF_answerback);
        int maxlen = strlen(answerback);

        term->answerback = snewn(maxlen, char);
        term->answerbacklen = 0;

        while (*answerback) {
            char *n;
            char c = ctrlparse(answerback, &n);
            if (n) {
                term->answerback[term->answerbacklen++] = c;
                answerback = n;
            } else {
                term->answerback[term->answerbacklen++] = *answerback++;
            }
        }
    }
}